

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ami_nvar.cpp
# Opt level: O0

void __thiscall ami_nvar_t::_read(ami_nvar_t *this)

{
  uint8_t uVar1;
  vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
  *this_00;
  nvar_entry_t *this_01;
  pointer this_02;
  kstream *this_03;
  bool local_69;
  unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_> local_40 [3];
  pointer local_28;
  nvar_entry_t *_;
  int i;
  ami_nvar_t *local_10;
  ami_nvar_t *this_local;
  
  local_10 = this;
  this_00 = (vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
             *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
  ::vector(this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>,std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>>>>>
              *)&stack0xffffffffffffffe8,this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,
              (unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
               *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
                 *)&stack0xffffffffffffffe8);
  _._4_4_ = 0;
  do {
    this_01 = (nvar_entry_t *)operator_new(0x108);
    nvar_entry_t::nvar_entry_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_28 = this_01;
    this_02 = std::
              unique_ptr<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>_>_>
              ::operator->(&this->m_entries);
    std::unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>>::
    unique_ptr<std::default_delete<ami_nvar_t::nvar_entry_t>,void>
              ((unique_ptr<ami_nvar_t::nvar_entry_t,std::default_delete<ami_nvar_t::nvar_entry_t>> *
               )local_40,local_28);
    std::
    vector<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>,_std::allocator<std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>_>_>
    ::push_back(this_02,(value_type *)local_40);
    std::unique_ptr<ami_nvar_t::nvar_entry_t,_std::default_delete<ami_nvar_t::nvar_entry_t>_>::
    ~unique_ptr(local_40);
    _._4_4_ = _._4_4_ + 1;
    uVar1 = nvar_entry_t::signature_first(local_28);
    local_69 = true;
    if (uVar1 == 'N') {
      this_03 = kaitai::kstruct::_io(&this->super_kstruct);
      local_69 = kaitai::kstream::is_eof(this_03);
    }
  } while (((local_69 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void ami_nvar_t::_read() {
    m_entries = std::unique_ptr<std::vector<std::unique_ptr<nvar_entry_t>>>(new std::vector<std::unique_ptr<nvar_entry_t>>());
    {
        int i = 0;
        nvar_entry_t* _;
        do {
            _ = new nvar_entry_t(m__io, this, m__root);
            m_entries->push_back(std::move(std::unique_ptr<nvar_entry_t>(_)));
            i++;
        } while (!( ((_->signature_first() != 78) || (_io()->is_eof())) ));
    }
}